

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

SQRESULT sq_getfunctioninfo(HSQUIRRELVM v,SQInteger level,SQFunctionInfo *fi)

{
  long lVar1;
  char *pcVar2;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  SQFunctionProto *proto;
  SQClosure *c;
  CallInfo *ci;
  SQInteger cssize;
  SQChar *in_stack_ffffffffffffffa8;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  char *local_48;
  SQRESULT local_8;
  
  if ((in_RSI < *(long *)(in_RDI + 200)) &&
     (lVar1 = *(long *)(in_RDI + 0xc0) + ((*(long *)(in_RDI + 200) - in_RSI) + -1) * 0x48,
     *(int *)(lVar1 + 0x10) == 0x8000100)) {
    lVar1 = *(long *)(*(long *)(lVar1 + 0x18) + 0x48);
    *in_RDX = lVar1;
    if (*(int *)(lVar1 + 0x40) == 0x8000010) {
      local_48 = (char *)(*(long *)(lVar1 + 0x48) + 0x38);
    }
    else {
      local_48 = "unknown";
    }
    in_RDX[1] = (long)local_48;
    if (*(int *)(lVar1 + 0x30) == 0x8000010) {
      pcVar2 = (char *)(*(long *)(lVar1 + 0x38) + 0x38);
    }
    else {
      pcVar2 = "unknown";
    }
    in_RDX[2] = (long)pcVar2;
    in_RDX[3] = **(long **)(lVar1 + 0x80);
    local_8 = 0;
  }
  else {
    local_8 = sq_throwerror(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  return local_8;
}

Assistant:

SQRESULT sq_getfunctioninfo(HSQUIRRELVM v,SQInteger level,SQFunctionInfo *fi)
{
    SQInteger cssize = v->_callsstacksize;
    if (cssize > level) {
        SQVM::CallInfo &ci = v->_callsstack[cssize-level-1];
        if(sq_isclosure(ci._closure)) {
            SQClosure *c = _closure(ci._closure);
            SQFunctionProto *proto = c->_function;
            fi->funcid = proto;
            fi->name = sq_type(proto->_name) == OT_STRING?_stringval(proto->_name):_SC("unknown");
            fi->source = sq_type(proto->_sourcename) == OT_STRING?_stringval(proto->_sourcename):_SC("unknown");
            fi->line = proto->_lineinfos[0]._line;
            return SQ_OK;
        }
    }
    return sq_throwerror(v,_SC("the object is not a closure"));
}